

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O0

vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *
dgrminer::compute_min_code
          (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
           *__return_storage_ptr__,
          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *edge_list)

{
  pointer *this;
  _Bit_pointer *this_00;
  allocator<bool> *this_01;
  allocator<int> *paVar1;
  allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_> *this_02;
  _Map_pointer *pppiVar2;
  value_type_conflict vVar3;
  int iVar4;
  value_type vVar5;
  value_type vVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  size_type sVar10;
  reference pvVar11;
  reference piVar12;
  reference pvVar13;
  reference pvVar14;
  mapped_type *pmVar15;
  ulong uVar16;
  reference pvVar17;
  reference pvVar18;
  reference pvVar19;
  reference pvVar20;
  reference pattern_edge2;
  reference rVar21;
  reference local_4d0;
  reference local_4c0;
  int local_4ac;
  mapped_type local_4a8;
  int sel_e_ind_1;
  int decremented2;
  int decremented1;
  _Bit_type local_498;
  reference local_490;
  int local_47c;
  int local_478;
  int sel_e_ind;
  int edge_candidate_ind;
  bool should_backtrack;
  size_t i_5;
  __normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
  local_460;
  undefined1 auStack_458 [8];
  labeled_pattern_edge e_candidate_1;
  array<int,_10UL> e_cand_1;
  int local_3f0;
  int local_3ec;
  int j_1;
  int i_4;
  labeled_pattern_edge e_candidate;
  array<int,_10UL> e_cand;
  int local_378;
  int j;
  int dst;
  int i_3;
  int src;
  vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
  edge_candidates;
  int right_most_vertex;
  int i_2;
  deque<int,_std::allocator<int>_> right_most_path_occurrence;
  deque<int,_std::allocator<int>_> right_most_path;
  key_type kStack_2a0;
  bool is_new_code_smaller;
  int i_1;
  undefined1 local_298 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> vertex_id_mapping;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  amount_of_usage_of_original_vertices;
  vector<int,_std::allocator<int>_> dst_vertices;
  vector<int,_std::allocator<int>_> src_vertices;
  undefined1 auStack_200 [4];
  int current_index;
  _Bit_type local_1f8;
  reference local_1f0;
  allocator<std::vector<int,_std::allocator<int>_>_> local_1d9;
  vector<int,_std::allocator<int>_> local_1d8;
  undefined1 local_1b8 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  all_edge_candidates_selected_edges_ind;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> local_198;
  undefined1 local_178 [8];
  vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
  all_edge_candidates;
  undefined1 local_158 [8];
  vector<int,_std::allocator<int>_> selected_candidates;
  undefined1 local_138 [8];
  vector<int,_std::allocator<int>_> selected_edges_ind;
  undefined1 local_118 [8];
  vector<bool,_std::allocator<bool>_> selected_edges;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> built_min_code;
  array<int,_10UL> built_min_code_edge;
  int min_edge_ind;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> indices_of_min_edges;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> starting_edges;
  array<int,_10UL> local_4c;
  int local_24;
  int local_20;
  int i;
  int n_edges;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *edge_list_local;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *minimum_code;
  
  i._3_1_ = 0;
  _n_edges = edge_list;
  edge_list_local = __return_storage_ptr__;
  std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::vector
            (__return_storage_ptr__);
  sVar10 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::size
                     (edge_list);
  local_20 = (int)sVar10;
  for (local_24 = 0; local_24 < local_20; local_24 = local_24 + 1) {
    pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
              operator[](edge_list,(long)local_24);
    flipPatternEdge(&local_4c,pvVar11);
    std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::push_back
              (edge_list,&local_4c);
  }
  this = &indices_of_min_edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)this);
  find_minimum_labelings
            ((vector<int,_std::allocator<int>_> *)&__range1,edge_list,
             (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)this,true);
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)&__range1);
  register0x00000000 =
       std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)&__range1);
  do {
    bVar7 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               (built_min_code_edge._M_elems + 9));
    if (!bVar7) {
      i._3_1_ = 1;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&__range1);
      std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~vector
                ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                 &indices_of_min_edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if ((i._3_1_ & 1) == 0) {
        std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~vector
                  (__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    piVar12 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator*(&__end1);
    built_min_code_edge._M_elems[8] = *piVar12;
    built_min_code.
    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
              operator[](edge_list,(long)built_min_code_edge._M_elems[8]);
    pvVar13 = std::array<int,_10UL>::operator[](pvVar11,2);
    built_min_code_edge._M_elems[0] = *pvVar13;
    pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
              operator[](edge_list,(long)built_min_code_edge._M_elems[8]);
    pvVar13 = std::array<int,_10UL>::operator[](pvVar11,3);
    built_min_code_edge._M_elems[1] = *pvVar13;
    pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
              operator[](edge_list,(long)built_min_code_edge._M_elems[8]);
    pvVar13 = std::array<int,_10UL>::operator[](pvVar11,4);
    built_min_code_edge._M_elems[2] = *pvVar13;
    pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
              operator[](edge_list,(long)built_min_code_edge._M_elems[8]);
    pvVar13 = std::array<int,_10UL>::operator[](pvVar11,5);
    built_min_code_edge._M_elems[3] = *pvVar13;
    pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
              operator[](edge_list,(long)built_min_code_edge._M_elems[8]);
    pvVar13 = std::array<int,_10UL>::operator[](pvVar11,6);
    built_min_code_edge._M_elems[4] = *pvVar13;
    pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
              operator[](edge_list,(long)built_min_code_edge._M_elems[8]);
    pvVar13 = std::array<int,_10UL>::operator[](pvVar11,7);
    built_min_code_edge._M_elems[5] = *pvVar13;
    pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
              operator[](edge_list,(long)built_min_code_edge._M_elems[8]);
    pvVar13 = std::array<int,_10UL>::operator[](pvVar11,8);
    built_min_code_edge._M_elems[6] = *pvVar13;
    pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
              operator[](edge_list,(long)built_min_code_edge._M_elems[8]);
    pvVar13 = std::array<int,_10UL>::operator[](pvVar11,9);
    built_min_code_edge._M_elems[7] = *pvVar13;
    sVar10 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::size
                       (__return_storage_ptr__);
    if (sVar10 == 0) {
LAB_0014af53:
      this_00 = &selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_end_of_storage;
      std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::vector
                ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)this_00);
      std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::push_back
                ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)this_00,
                 (value_type *)
                 ((long)&built_min_code.
                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      iVar9 = local_20 * 2;
      selected_edges_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      this_01 = (allocator<bool> *)
                ((long)&selected_edges_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 6);
      std::allocator<bool>::allocator(this_01);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)local_118,(long)iVar9,
                 (bool *)((long)&selected_edges_ind.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7),this_01);
      std::allocator<bool>::~allocator
                ((allocator<bool> *)
                 ((long)&selected_edges_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 6));
      sVar10 = (size_type)local_20;
      selected_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0xffffffff;
      paVar1 = (allocator<int> *)
               ((long)&selected_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 3);
      std::allocator<int>::allocator(paVar1);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_138,sVar10,
                 (value_type_conflict *)
                 ((long)&selected_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4),paVar1);
      std::allocator<int>::~allocator
                ((allocator<int> *)
                 ((long)&selected_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 3));
      sVar10 = (size_type)local_20;
      all_edge_candidates.
      super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      paVar1 = (allocator<int> *)
               ((long)&all_edge_candidates.
                       super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
      std::allocator<int>::allocator(paVar1);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_158,sVar10,
                 (value_type_conflict *)
                 ((long)&all_edge_candidates.
                         super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),paVar1);
      std::allocator<int>::~allocator
                ((allocator<int> *)
                 ((long)&all_edge_candidates.
                         super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
      sVar10 = (size_type)local_20;
      local_198.super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_198.super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_198.super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::vector
                (&local_198);
      this_02 = (allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>
                 *)((long)&all_edge_candidates_selected_edges_ind.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>::
      allocator(this_02);
      std::
      vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
      ::vector((vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                *)local_178,sVar10,&local_198,this_02);
      std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>::
      ~allocator((allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>
                  *)((long)&all_edge_candidates_selected_edges_ind.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~vector
                (&local_198);
      sVar10 = (size_type)local_20;
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::vector(&local_1d8);
      std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(&local_1d9);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)local_1b8,sVar10,&local_1d8,&local_1d9);
      std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator(&local_1d9);
      std::vector<int,_std::allocator<int>_>::~vector(&local_1d8);
      iVar9 = built_min_code_edge._M_elems[8];
      pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_138,0);
      *pvVar14 = iVar9;
      rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_118,
                          (long)built_min_code_edge._M_elems[8]);
      local_1f0 = rVar21;
      std::_Bit_reference::operator=(&local_1f0,true);
      rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_118,
                          (long)((built_min_code_edge._M_elems[8] + local_20) % (local_20 * 2)));
      _auStack_200 = rVar21;
      std::_Bit_reference::operator=((_Bit_reference *)auStack_200,true);
      src_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 1;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 &dst_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 &amount_of_usage_of_original_vertices._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 &vertex_id_mapping._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 local_298);
      pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                operator[](edge_list,(long)built_min_code_edge._M_elems[8]);
      pvVar13 = std::array<int,_10UL>::operator[](pvVar11,0);
      vVar3 = *pvVar13;
      i_1 = 0;
      pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)local_298,&i_1);
      *pmVar15 = vVar3;
      pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                operator[](edge_list,(long)built_min_code_edge._M_elems[8]);
      pvVar13 = std::array<int,_10UL>::operator[](pvVar11,1);
      vVar3 = *pvVar13;
      kStack_2a0 = 1;
      pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)local_298,&stack0xfffffffffffffd60);
      *pmVar15 = vVar3;
      right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_node._4_4_ = 0;
      while( true ) {
        sVar10 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::size
                           (edge_list);
        if (sVar10 <= (ulong)(long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_) break;
        pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                  operator[](edge_list,
                             (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
        pvVar13 = std::array<int,_10UL>::operator[](pvVar11,0);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &dst_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,pvVar13);
        pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                  operator[](edge_list,
                             (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
        pvVar13 = std::array<int,_10UL>::operator[](pvVar11,1);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &amount_of_usage_of_original_vertices._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count,pvVar13);
        pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                  operator[](edge_list,
                             (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
        pvVar13 = std::array<int,_10UL>::operator[](pvVar11,0);
        pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&vertex_id_mapping._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             pvVar13);
        *pmVar15 = 0;
        pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                  operator[](edge_list,
                             (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
        pvVar13 = std::array<int,_10UL>::operator[](pvVar11,1);
        pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&vertex_id_mapping._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             pvVar13);
        *pmVar15 = 0;
        right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_node._4_4_ =
             right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node._4_4_ + 1;
      }
      pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                operator[](edge_list,(long)built_min_code_edge._M_elems[8]);
      pvVar13 = std::array<int,_10UL>::operator[](pvVar11,0);
      pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&vertex_id_mapping._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           pvVar13);
      *pmVar15 = 1;
      pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                operator[](edge_list,(long)built_min_code_edge._M_elems[8]);
      pvVar13 = std::array<int,_10UL>::operator[](pvVar11,1);
      pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)&vertex_id_mapping._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           pvVar13);
      *pmVar15 = 1;
      while( true ) {
        if (local_20 <=
            src_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_) {
          sVar10 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::size
                             (__return_storage_ptr__);
          if (sVar10 == 0) {
            std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator=
                      (__return_storage_ptr__,
                       (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                       &selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage);
          }
          else {
            bVar7 = is_code_smaller_than
                              ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                *)&selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl
                                   .super__Bvector_impl_data._M_end_of_storage,
                               __return_storage_ptr__,true);
            if (bVar7) {
              std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator=
                        (__return_storage_ptr__,
                         (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                         &selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage);
            }
          }
          src_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage._4_4_ =
               src_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + -1;
        }
        if (src_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ == 0) break;
        pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)local_158,
                             (long)src_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        if (*pvVar14 == 0) {
          find_rightmost_path((deque<int,_std::allocator<int>_> *)
                              &right_most_path_occurrence.
                               super__Deque_base<int,_std::allocator<int>_>._M_impl.
                               super__Deque_impl_data._M_finish._M_node,
                              (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                               *)&selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_end_of_storage);
          std::deque<int,_std::allocator<int>_>::deque
                    ((deque<int,_std::allocator<int>_> *)&right_most_vertex);
          edge_candidates.
          super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          while( true ) {
            uVar16 = (ulong)edge_candidates.
                            super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            sVar10 = std::deque<int,_std::allocator<int>_>::size
                               ((deque<int,_std::allocator<int>_> *)
                                &right_most_path_occurrence.
                                 super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                 super__Deque_impl_data._M_finish._M_node);
            if (sVar10 <= uVar16) break;
            pvVar17 = std::deque<int,_std::allocator<int>_>::operator[]
                                ((deque<int,_std::allocator<int>_> *)
                                 &right_most_path_occurrence.
                                  super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                  super__Deque_impl_data._M_finish._M_node,
                                 (long)edge_candidates.
                                       super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            pmVar15 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_298,pvVar17);
            std::deque<int,_std::allocator<int>_>::push_back
                      ((deque<int,_std::allocator<int>_> *)&right_most_vertex,pmVar15);
            edge_candidates.
            super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 edge_candidates.
                 super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
          }
          pvVar17 = std::deque<int,_std::allocator<int>_>::back
                              ((deque<int,_std::allocator<int>_> *)&right_most_vertex);
          edge_candidates.
          super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = *pvVar17;
          std::
          vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>::
          vector((vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                  *)&i_3);
          iVar9 = (value_type)
                  edge_candidates.
                  super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
          j = 0;
          while( true ) {
            sVar10 = std::deque<int,_std::allocator<int>_>::size
                               ((deque<int,_std::allocator<int>_> *)
                                &right_most_path_occurrence.
                                 super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                 super__Deque_impl_data._M_finish._M_node);
            if (sVar10 - 1 <= (ulong)(long)j) break;
            pvVar17 = std::deque<int,_std::allocator<int>_>::operator[]
                                ((deque<int,_std::allocator<int>_> *)&right_most_vertex,(long)j);
            iVar4 = *pvVar17;
            local_378 = 0;
            while( true ) {
              sVar10 = std::vector<bool,_std::allocator<bool>_>::size
                                 ((vector<bool,_std::allocator<bool>_> *)local_118);
              if (sVar10 <= (ulong)(long)local_378) break;
              rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)local_118,(long)local_378);
              e_cand._M_elems._32_8_ = rVar21._M_p;
              bVar8 = std::_Bit_reference::operator_cast_to_bool
                                ((_Bit_reference *)(e_cand._M_elems + 8));
              bVar7 = false;
              if (!bVar8) {
                pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)
                                     &dst_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (long)local_378);
                bVar7 = false;
                if (*pvVar14 == iVar9) {
                  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       &amount_of_usage_of_original_vertices._M_t._M_impl.
                                        super__Rb_tree_header._M_node_count,(long)local_378);
                  bVar7 = *pvVar14 == iVar4;
                }
              }
              if (bVar7) {
                pppiVar2 = &right_most_path_occurrence.super__Deque_base<int,_std::allocator<int>_>.
                            _M_impl.super__Deque_impl_data._M_finish._M_node;
                pvVar17 = std::deque<int,_std::allocator<int>_>::back
                                    ((deque<int,_std::allocator<int>_> *)pppiVar2);
                vVar5 = *pvVar17;
                pvVar17 = std::deque<int,_std::allocator<int>_>::operator[]
                                    ((deque<int,_std::allocator<int>_> *)pppiVar2,(long)j);
                vVar6 = *pvVar17;
                pvVar11 = std::
                          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                          operator[](edge_list,(long)local_378);
                pvVar13 = std::array<int,_10UL>::operator[](pvVar11,2);
                e_cand._M_elems[0] = *pvVar13;
                pvVar11 = std::
                          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                          operator[](edge_list,(long)local_378);
                pvVar13 = std::array<int,_10UL>::operator[](pvVar11,3);
                e_cand._M_elems[1] = *pvVar13;
                pvVar11 = std::
                          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                          operator[](edge_list,(long)local_378);
                pvVar13 = std::array<int,_10UL>::operator[](pvVar11,4);
                e_cand._M_elems[2] = *pvVar13;
                pvVar11 = std::
                          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                          operator[](edge_list,(long)local_378);
                pvVar13 = std::array<int,_10UL>::operator[](pvVar11,5);
                e_cand._M_elems[3] = *pvVar13;
                pvVar11 = std::
                          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                          operator[](edge_list,(long)local_378);
                pvVar13 = std::array<int,_10UL>::operator[](pvVar11,6);
                e_cand._M_elems[4] = *pvVar13;
                pvVar11 = std::
                          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                          operator[](edge_list,(long)local_378);
                pvVar13 = std::array<int,_10UL>::operator[](pvVar11,7);
                e_cand._M_elems[5] = *pvVar13;
                pvVar11 = std::
                          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                          operator[](edge_list,(long)local_378);
                pvVar13 = std::array<int,_10UL>::operator[](pvVar11,8);
                e_cand._M_elems[6] = *pvVar13;
                pvVar11 = std::
                          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                          operator[](edge_list,(long)local_378);
                pvVar13 = std::array<int,_10UL>::operator[](pvVar11,9);
                e_cand._M_elems[7] = *pvVar13;
                e_candidate.elements._M_elems[7] = e_cand._M_elems[7];
                e_candidate.elements._M_elems[6] = e_cand._M_elems[6];
                unique0x100012b5 = vVar6;
                j_1 = vVar5;
                e_candidate.elements._M_elems[1] = e_cand._M_elems[1];
                e_candidate.elements._M_elems[0] = e_cand._M_elems[0];
                e_candidate.elements._M_elems[3] = e_cand._M_elems[3];
                e_candidate.elements._M_elems[2] = e_cand._M_elems[2];
                e_candidate.elements._M_elems[5] = e_cand._M_elems[5];
                e_candidate.elements._M_elems[4] = e_cand._M_elems[4];
                e_candidate.elements._M_elems[8] = local_378;
                std::
                vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                ::push_back((vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                             *)&i_3,(value_type *)&j_1);
              }
              local_378 = local_378 + 1;
            }
            j = j + 1;
          }
          sVar10 = std::deque<int,_std::allocator<int>_>::size
                             ((deque<int,_std::allocator<int>_> *)
                              &right_most_path_occurrence.
                               super__Deque_base<int,_std::allocator<int>_>._M_impl.
                               super__Deque_impl_data._M_finish._M_node);
          local_3ec = (int)sVar10;
          while (local_3ec = local_3ec + -1, -1 < local_3ec) {
            pvVar17 = std::deque<int,_std::allocator<int>_>::operator[]
                                ((deque<int,_std::allocator<int>_> *)&right_most_vertex,
                                 (long)local_3ec);
            iVar9 = *pvVar17;
            local_3f0 = 0;
            while( true ) {
              sVar10 = std::vector<bool,_std::allocator<bool>_>::size
                                 ((vector<bool,_std::allocator<bool>_> *)local_118);
              if (sVar10 <= (ulong)(long)local_3f0) break;
              rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)local_118,(long)local_3f0);
              e_cand_1._M_elems._32_8_ = rVar21._M_p;
              bVar8 = std::_Bit_reference::operator_cast_to_bool
                                ((_Bit_reference *)(e_cand_1._M_elems + 8));
              bVar7 = false;
              if (!bVar8) {
                pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)
                                     &dst_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (long)local_3f0);
                bVar7 = false;
                if (*pvVar14 == iVar9) {
                  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)
                                       &amount_of_usage_of_original_vertices._M_t._M_impl.
                                        super__Rb_tree_header._M_node_count,(long)local_3f0);
                  pmVar15 = std::
                            map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                          *)&vertex_id_mapping._M_t._M_impl.super__Rb_tree_header.
                                             _M_node_count,pvVar14);
                  bVar7 = *pmVar15 == 0;
                }
              }
              if (bVar7) {
                pppiVar2 = &right_most_path_occurrence.super__Deque_base<int,_std::allocator<int>_>.
                            _M_impl.super__Deque_impl_data._M_finish._M_node;
                pvVar17 = std::deque<int,_std::allocator<int>_>::operator[]
                                    ((deque<int,_std::allocator<int>_> *)pppiVar2,(long)local_3ec);
                e_candidate_1.index = *pvVar17;
                pvVar17 = std::deque<int,_std::allocator<int>_>::back
                                    ((deque<int,_std::allocator<int>_> *)pppiVar2);
                iVar4 = *pvVar17;
                pvVar11 = std::
                          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                          operator[](edge_list,(long)local_3f0);
                pvVar13 = std::array<int,_10UL>::operator[](pvVar11,2);
                e_cand_1._M_elems[0] = *pvVar13;
                pvVar11 = std::
                          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                          operator[](edge_list,(long)local_3f0);
                pvVar13 = std::array<int,_10UL>::operator[](pvVar11,3);
                e_cand_1._M_elems[1] = *pvVar13;
                pvVar11 = std::
                          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                          operator[](edge_list,(long)local_3f0);
                pvVar13 = std::array<int,_10UL>::operator[](pvVar11,4);
                e_cand_1._M_elems[2] = *pvVar13;
                pvVar11 = std::
                          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                          operator[](edge_list,(long)local_3f0);
                pvVar13 = std::array<int,_10UL>::operator[](pvVar11,5);
                e_cand_1._M_elems[3] = *pvVar13;
                pvVar11 = std::
                          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                          operator[](edge_list,(long)local_3f0);
                pvVar13 = std::array<int,_10UL>::operator[](pvVar11,6);
                e_cand_1._M_elems[4] = *pvVar13;
                pvVar11 = std::
                          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                          operator[](edge_list,(long)local_3f0);
                pvVar13 = std::array<int,_10UL>::operator[](pvVar11,7);
                e_cand_1._M_elems[5] = *pvVar13;
                pvVar11 = std::
                          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                          operator[](edge_list,(long)local_3f0);
                pvVar13 = std::array<int,_10UL>::operator[](pvVar11,8);
                e_cand_1._M_elems[6] = *pvVar13;
                pvVar11 = std::
                          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                          operator[](edge_list,(long)local_3f0);
                pvVar13 = std::array<int,_10UL>::operator[](pvVar11,9);
                e_cand_1._M_elems[7] = *pvVar13;
                e_candidate_1.elements._M_elems[7] = e_cand_1._M_elems[7];
                e_candidate_1.elements._M_elems[6] = e_cand_1._M_elems[6];
                auStack_458._4_4_ = iVar4 + 1;
                auStack_458._0_4_ = e_candidate_1.index;
                e_candidate_1.elements._M_elems[1] = e_cand_1._M_elems[1];
                e_candidate_1.elements._M_elems[0] = e_cand_1._M_elems[0];
                e_candidate_1.elements._M_elems[3] = e_cand_1._M_elems[3];
                e_candidate_1.elements._M_elems[2] = e_cand_1._M_elems[2];
                e_candidate_1.elements._M_elems[5] = e_cand_1._M_elems[5];
                e_candidate_1.elements._M_elems[4] = e_cand_1._M_elems[4];
                e_candidate_1.elements._M_elems[8] = local_3f0;
                std::
                vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                ::push_back((vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                             *)&i_3,(value_type *)auStack_458);
              }
              local_3f0 = local_3f0 + 1;
            }
          }
          local_460._M_current =
               (labeled_pattern_edge *)
               std::
               vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
               ::begin((vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                        *)&i_3);
          i_5 = (size_t)std::
                        vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                        ::end((vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                               *)&i_3);
          std::
          sort<__gnu_cxx::__normal_iterator<dgrminer::labeled_pattern_edge*,std::vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>>,bool(*)(dgrminer::labeled_pattern_edge_const&,dgrminer::labeled_pattern_edge_const&)>
                    (local_460,
                     (__normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
                      )i_5,cmp_labeled_pattern_edge);
          pvVar18 = std::
                    vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                    ::operator[]((vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                                  *)local_178,
                                 (long)src_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::clear
                    (pvVar18);
          pvVar19 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  *)local_1b8,
                                 (long)src_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          std::vector<int,_std::allocator<int>_>::clear(pvVar19);
          _edge_candidate_ind = 0;
          while( true ) {
            uVar16 = _edge_candidate_ind;
            sVar10 = std::
                     vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                     ::size((vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                             *)&i_3);
            if (sVar10 <= uVar16) break;
            if (_edge_candidate_ind != 0) {
              pvVar20 = std::
                        vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                        ::operator[]((vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                                      *)&i_3,_edge_candidate_ind - 1);
              pattern_edge2 =
                   std::
                   vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                   ::operator[]((vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                                 *)&i_3,_edge_candidate_ind);
              bVar7 = is_pattern_edge_smaller_than(&pvVar20->elements,&pattern_edge2->elements,true)
              ;
              if (bVar7) break;
            }
            pvVar18 = std::
                      vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                      ::operator[]((vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                                    *)local_178,
                                   (long)src_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            pvVar20 = std::
                      vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                      ::operator[]((vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                                    *)&i_3,_edge_candidate_ind);
            std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::push_back
                      (pvVar18,&pvVar20->elements);
            pvVar19 = std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    *)local_1b8,
                                   (long)src_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            pvVar20 = std::
                      vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                      ::operator[]((vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                                    *)&i_3,_edge_candidate_ind);
            std::vector<int,_std::allocator<int>_>::push_back(pvVar19,&pvVar20->index);
            _edge_candidate_ind = _edge_candidate_ind + 1;
          }
          std::
          vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>::
          ~vector((vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                   *)&i_3);
          std::deque<int,_std::allocator<int>_>::~deque
                    ((deque<int,_std::allocator<int>_> *)&right_most_vertex);
          std::deque<int,_std::allocator<int>_>::~deque
                    ((deque<int,_std::allocator<int>_> *)
                     &right_most_path_occurrence.super__Deque_base<int,_std::allocator<int>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_node);
        }
        sel_e_ind._3_1_ = 1;
        pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)local_158,
                             (long)src_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        local_478 = *pvVar14;
        uVar16 = (ulong)local_478;
        pvVar18 = std::
                  vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                  ::operator[]((vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                                *)local_178,
                               (long)src_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        sVar10 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::size
                           (pvVar18);
        if (uVar16 < sVar10) {
          iVar9 = local_478 + 1;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_158,
                               (long)src_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          *pvVar14 = iVar9;
          pvVar18 = std::
                    vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                    ::operator[]((vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                                  *)local_178,
                                 (long)src_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                    operator[](pvVar18,(long)local_478);
          std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::push_back
                    ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                     &selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage,pvVar11);
          pvVar19 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  *)local_1b8,
                                 (long)src_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](pvVar19,(long)local_478);
          pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                    operator[](edge_list,(long)*pvVar14);
          pvVar13 = std::array<int,_10UL>::operator[](pvVar11,0);
          vVar3 = *pvVar13;
          pvVar18 = std::
                    vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                    ::operator[]((vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                                  *)local_178,
                                 (long)src_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                    operator[](pvVar18,(long)local_478);
          pvVar13 = std::array<int,_10UL>::operator[](pvVar11,0);
          pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_298,pvVar13);
          *pmVar15 = vVar3;
          pvVar19 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  *)local_1b8,
                                 (long)src_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](pvVar19,(long)local_478);
          pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                    operator[](edge_list,(long)*pvVar14);
          pvVar13 = std::array<int,_10UL>::operator[](pvVar11,1);
          vVar3 = *pvVar13;
          pvVar18 = std::
                    vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                    ::operator[]((vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                                  *)local_178,
                                 (long)src_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                    operator[](pvVar18,(long)local_478);
          pvVar13 = std::array<int,_10UL>::operator[](pvVar11,1);
          pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_298,pvVar13);
          *pmVar15 = vVar3;
          pvVar19 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  *)local_1b8,
                                 (long)src_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](pvVar19,(long)local_478);
          pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                    operator[](edge_list,(long)*pvVar14);
          pvVar13 = std::array<int,_10UL>::operator[](pvVar11,0);
          pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&vertex_id_mapping._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count,pvVar13);
          *pmVar15 = *pmVar15 + 1;
          pvVar19 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  *)local_1b8,
                                 (long)src_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](pvVar19,(long)local_478);
          pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                    operator[](edge_list,(long)*pvVar14);
          pvVar13 = std::array<int,_10UL>::operator[](pvVar11,1);
          pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&vertex_id_mapping._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count,pvVar13);
          *pmVar15 = *pmVar15 + 1;
          pvVar19 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  *)local_1b8,
                                 (long)src_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](pvVar19,(long)local_478);
          vVar5 = *pvVar14;
          local_47c = vVar5;
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_138,
                               (long)src_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          *pvVar14 = vVar5;
          rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_118,(long)local_47c);
          local_490 = rVar21;
          std::_Bit_reference::operator=(&local_490,true);
          rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_118,
                              (long)((local_47c + local_20) % (local_20 * 2)));
          _decremented2 = rVar21;
          std::_Bit_reference::operator=((_Bit_reference *)&decremented2,true);
          src_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage._4_4_ =
               src_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
          sel_e_ind._3_1_ = 0;
        }
        if ((sel_e_ind._3_1_ & 1) != 0) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_158,
                               (long)src_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          *pvVar14 = 0;
          pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                    back((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                         &selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage);
          pvVar13 = std::array<int,_10UL>::operator[](pvVar11,0);
          pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_298,pvVar13);
          sel_e_ind_1 = *pmVar15;
          pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                    back((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                         &selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage);
          pvVar13 = std::array<int,_10UL>::operator[](pvVar11,1);
          pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_298,pvVar13);
          local_4a8 = *pmVar15;
          pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&vertex_id_mapping._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count,&sel_e_ind_1);
          *pmVar15 = *pmVar15 + -1;
          pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&vertex_id_mapping._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count,&local_4a8);
          *pmVar15 = *pmVar15 + -1;
          std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::pop_back
                    ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                     &selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage);
          pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_138,
                               (long)src_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          local_4ac = *pvVar14;
          if (local_4ac != -1) {
            rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)local_118,(long)local_4ac);
            local_4c0 = rVar21;
            std::_Bit_reference::operator=(&local_4c0,false);
            rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)local_118,
                                (long)((local_4ac + local_20) % (local_20 * 2)));
            local_4d0 = rVar21;
            std::_Bit_reference::operator=(&local_4d0,false);
            pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_138,
                                 (long)src_vertices.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            *pvVar14 = -1;
          }
          src_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage._4_4_ =
               src_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + -1;
        }
      }
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 local_298);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 &vertex_id_mapping._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &amount_of_usage_of_original_vertices._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &dst_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_1b8);
      std::
      vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
      ::~vector((vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                 *)local_178);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_158);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_138);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_118);
      std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~vector
                ((vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
                 &selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage);
    }
    else {
      pvVar11 = std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                operator[](__return_storage_ptr__,0);
      bVar7 = is_pattern_edge_smaller_than
                        (pvVar11,(array<int,_10UL> *)
                                 ((long)&built_min_code.
                                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                         true);
      if (!bVar7) goto LAB_0014af53;
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  } while( true );
}

Assistant:

std::vector<std::array<int, 10>> compute_min_code(std::vector<std::array<int, 10>> edge_list)
    {

        //here we will eventually save the minimum code
        //at the end, we compare it with the current code and decide
        std::vector<std::array<int, 10>> minimum_code;


        int n_edges = edge_list.size();
        for (int i = 0; i < n_edges; i++)
        {
            edge_list.push_back(flipPatternEdge(edge_list[i]));
        }

        std::vector<std::array<int, 8>> starting_edges;

        std::vector<int> indices_of_min_edges = find_minimum_labelings(edge_list, starting_edges, true);

        for (int min_edge_ind : indices_of_min_edges)
        {
            std::array<int, 10> built_min_code_edge = {0, 1, edge_list[min_edge_ind][2], edge_list[min_edge_ind][3],
                                                       edge_list[min_edge_ind][4],
                                                       edge_list[min_edge_ind][5], edge_list[min_edge_ind][6],
                                                       edge_list[min_edge_ind][7], edge_list[min_edge_ind][8],
                                                       edge_list[min_edge_ind][9]};

            // if we already have some min code saved, try to compare the current pattern being built
            // if the current min code is smaller, then just try another init edge
            if (minimum_code.size() > 0 && is_pattern_edge_smaller_than(minimum_code[0], built_min_code_edge, true))
            {
                continue;
            }

            std::vector<std::array<int, 10>> built_min_code;
            built_min_code.push_back(built_min_code_edge);


            std::vector<bool> selected_edges(2 * n_edges, false);
            std::vector<int> selected_edges_ind(n_edges, -1);

            std::vector<int> selected_candidates(n_edges,
                                                 0);  // which candidate was chosen for each edge (used for backtracking)
            // which candidates are possible for each edge (used for backtracking), we are not interested in the 1st element
            std::vector<std::vector<std::array<int, 10>>> all_edge_candidates(n_edges,
                                                                              std::vector<std::array<int, 10>>());
            std::vector<std::vector<int>> all_edge_candidates_selected_edges_ind(n_edges, std::vector<int>());

            selected_edges_ind[0] = min_edge_ind;
            selected_edges[min_edge_ind] = true;  // set the first edge as occupied
            selected_edges[(min_edge_ind + n_edges) %
                           (2 * n_edges)] = true;  // the reversed direction of the edge will be also occupied

            int current_index = 1;

            std::vector<int> src_vertices;
            std::vector<int> dst_vertices;

            // how many edges in built_min_code use the vertices?
            std::map<int, int> amount_of_usage_of_original_vertices;

            // here we keep the mapping of min_code ids to edge_list vertex ids:
            std::map<int, int> vertex_id_mapping;
            vertex_id_mapping[0] = edge_list[min_edge_ind][0];
            vertex_id_mapping[1] = edge_list[min_edge_ind][1];

            for (int i = 0; i < edge_list.size(); i++)
            {
                src_vertices.push_back(edge_list[i][0]);
                dst_vertices.push_back(edge_list[i][1]);
                // all nodes are used 0-times at first
                amount_of_usage_of_original_vertices[edge_list[i][0]] = 0;
                amount_of_usage_of_original_vertices[edge_list[i][1]] = 0;
            }

            // we occupied the first two nodes:
            amount_of_usage_of_original_vertices[edge_list[min_edge_ind][0]] = 1;
            amount_of_usage_of_original_vertices[edge_list[min_edge_ind][1]] = 1;

            // do DFS
            while (true)
            {
                if (current_index >= n_edges)
                {
                    // we generated a code from all edges

                    // we did not generate a smaller code,
                    // try different code (the next one may be even smaller)
                    if (minimum_code.size() == 0)
                    {
                        // just save this first code as minimum
                        minimum_code = built_min_code;
                    }
                    else
                    {
                        // compare it with the latest "minimum code" and if necessary, save the new one:
                        bool is_new_code_smaller = is_code_smaller_than(built_min_code, minimum_code, true);
                        if (is_new_code_smaller)
                        {
                            minimum_code = built_min_code;
                        }
                    }
                    // backtrack
                    current_index--;

                }
                if (current_index == 0)
                {
                    // (we have tried all posibilities from the current initial edge)
                    // we backtracked back to 0, we should start finding the minimum code from other position (break the repeat loop)
                    // (we couldn't find it here)
                    break;
                }

                // we just moved by one edge, find all candidates for growing the the pattern:
                if (selected_candidates[current_index] == 0)
                {
                    std::deque<int> right_most_path = find_rightmost_path(built_min_code);
                    std::deque<int> right_most_path_occurrence;
                    for (int i = 0; i < right_most_path.size(); i++)
                    {
                        right_most_path_occurrence.push_back(vertex_id_mapping[right_most_path[i]]);
                    }
                    int right_most_vertex = right_most_path_occurrence.back();

                    std::vector<labeled_pattern_edge> edge_candidates;

                    // find backward edge candidates:
                    int src = right_most_vertex;
                    for (int i = 0; i < right_most_path.size() - 1; i++)
                    {
                        int dst = right_most_path_occurrence[i];
                        for (int j = 0; j < selected_edges.size(); j++)
                        {
                            if (!selected_edges[j] && src_vertices[j] == src && dst_vertices[j] == dst)
                            {

                                std::array<int, 10> e_cand = {right_most_path.back(), right_most_path[i],
                                                              edge_list[j][2], edge_list[j][3], edge_list[j][4],
                                                              edge_list[j][5], edge_list[j][6], edge_list[j][7],
                                                              edge_list[j][8], edge_list[j][9]};


                                labeled_pattern_edge e_candidate;
                                e_candidate.elements = e_cand;
                                e_candidate.index = j;
                                edge_candidates.push_back(e_candidate);
                            }
                        }
                    }

                    // find forward edge candidates:
                    for (int i = right_most_path.size() - 1; i >= 0; i--)
                    {
                        src = right_most_path_occurrence[i];
                        for (int j = 0; j < selected_edges.size(); j++)
                        {
                            if (!selected_edges[j] && src_vertices[j] == src &&
                                amount_of_usage_of_original_vertices[dst_vertices[j]] == 0)
                            {
                                std::array<int, 10> e_cand = {right_most_path[i], right_most_path.back() + 1,
                                                              edge_list[j][2], edge_list[j][3], edge_list[j][4],
                                                              edge_list[j][5], edge_list[j][6], edge_list[j][7],
                                                              edge_list[j][8], edge_list[j][9]};


                                labeled_pattern_edge e_candidate;
                                e_candidate.elements = e_cand;
                                e_candidate.index = j;
                                edge_candidates.push_back(e_candidate);
                            }
                        }
                    }

                    std::sort(edge_candidates.begin(), edge_candidates.end(), cmp_labeled_pattern_edge);

                    all_edge_candidates[current_index].clear();
                    all_edge_candidates_selected_edges_ind[current_index].clear();
                    for (size_t i = 0; i < edge_candidates.size(); i++)
                    {
                        if (i > 0 &&
                            is_pattern_edge_smaller_than(edge_candidates[i - 1].elements, edge_candidates[i].elements,
                                                         true))
                        {
                            // don't take candidates that cannot have smaller code
                            break;
                        }
                        all_edge_candidates[current_index].push_back(edge_candidates[i].elements);
                        all_edge_candidates_selected_edges_ind[current_index].push_back(edge_candidates[i].index);
                    }
                }


                // try to use the candidates

                bool should_backtrack = true;
                for (int edge_candidate_ind = selected_candidates[current_index];
                     edge_candidate_ind < all_edge_candidates[current_index].size(); edge_candidate_ind++)
                {


                    //if (minimum_code.size() > 0 && is_pattern_edge_smaller_than(minimum_code[current_index], all_edge_candidates[current_index][edge_candidate_ind], true))
                    //{
                    //	// we should backtrack
                    //	break;
                    //}

                    //if (is_pattern_edge_equal_to(all_edge_candidates[current_index][edge_candidate_ind], edge_list[current_index], true))
                    //{
                    // they are same, so append it and move to other edge
                    // NOTE: there can be several edges with the same code (if necessary, these must be tested later as well)
                    selected_candidates[current_index] = edge_candidate_ind + 1;
                    built_min_code.push_back(all_edge_candidates[current_index][edge_candidate_ind]);

                    vertex_id_mapping[all_edge_candidates[current_index][edge_candidate_ind][0]] = edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][0];
                    vertex_id_mapping[all_edge_candidates[current_index][edge_candidate_ind][1]] = edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][1];

                    amount_of_usage_of_original_vertices[edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][0]] += 1;
                    amount_of_usage_of_original_vertices[edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][1]] += 1;

                    int sel_e_ind = all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind];
                    selected_edges_ind[current_index] = sel_e_ind;
                    selected_edges[sel_e_ind] = true;
                    selected_edges[(sel_e_ind + n_edges) % (2 * n_edges)] = true;

                    current_index++;
                    should_backtrack = false;
                    break;
                    //}
                }

                // the candidate edge made larger code or we don't have more candidates to try:
                if (should_backtrack)
                {
                    selected_candidates[current_index] = 0;

                    // now we need to decrement the usage of these two vertices:
                    int decremented1 = vertex_id_mapping[built_min_code.back()[0]];
                    int decremented2 = vertex_id_mapping[built_min_code.back()[1]];
                    amount_of_usage_of_original_vertices[decremented1] -= 1;
                    amount_of_usage_of_original_vertices[decremented2] -= 1;

                    built_min_code.pop_back();

                    int sel_e_ind = selected_edges_ind[current_index];
                    if (sel_e_ind != -1)
                    {
                        selected_edges[sel_e_ind] = false;
                        selected_edges[(sel_e_ind + n_edges) % (2 * n_edges)] = false;
                        selected_edges_ind[current_index] = -1;
                    }

                    current_index--;
                }
            }

        }

        // we could not find a smaller code
        return minimum_code;
    }